

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

bool __thiscall
slang::ast::ASTContext::requireGtZero(ASTContext *this,optional<int> value,SourceRange range)

{
  SourceRange sourceRange;
  bool bVar1;
  int *piVar2;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  DiagCode in_ESI;
  ASTContext *in_RDI;
  undefined1 local_1;
  
  bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x82979b);
  if (bVar1) {
    piVar2 = std::optional<int>::operator*((optional<int> *)0x8297b0);
    if (*piVar2 < 1) {
      sourceRange.endLoc = in_RCX;
      sourceRange.startLoc = in_RDX;
      addDiag(in_RDI,in_ESI,sourceRange);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ASTContext::requireGtZero(std::optional<int32_t> value, SourceRange range) const {
    if (!value)
        return false;

    if (*value <= 0) {
        addDiag(diag::ValueMustBePositive, range);
        return false;
    }
    return true;
}